

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QString * __thiscall
QFileDialog::selectedMimeTypeFilter(QString *__return_storage_ptr__,QFileDialog *this)

{
  QDialogPrivate *this_00;
  QArrayData *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  QString *data;
  QPlatformDialogHelper *pQVar6;
  long lVar7;
  QString *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QStringView QVar10;
  QStringView QVar11;
  QArrayDataPointer<QString> local_e8;
  QArrayDataPointer<QString> local_d0;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((this_00->nativeDialogInUse != false) ||
     (this_00[1].super_QWidgetPrivate.focus_child == (QWidget *)0x0)) {
    pQVar6 = QDialogPrivate::platformHelper(this_00);
    if (pQVar6 == (QPlatformDialogHelper *)0x0) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QString *)0x0;
      local_58.size = 0;
    }
    else {
      (**(code **)(*(long *)pQVar6 + 0xc0))(&local_58,pQVar6);
    }
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pQVar8 = (QString *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_58.d;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_58.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.size;
    local_58.d = (Data *)pQVar1;
    local_58.ptr = pQVar8;
    local_58.size = qVar2;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
    QFileDialogOptions::mimeTypeFilters();
    bVar9 = local_58.size != 0;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  else {
    bVar9 = false;
  }
  if (bVar9) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    selectedNameFilter(&local_78,this);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QFileDialogOptions::mimeTypeFilters();
    if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
      lVar7 = local_98.size * 0x18;
      pQVar8 = local_98.ptr;
      do {
        local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        nameFilterForMime(&local_b8,pQVar8);
        cVar5 = QFileDialogOptions::testOption
                          ((FileDialogOption)
                           *(undefined8 *)
                            (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x3d0));
        qVar2 = local_b8.d.size;
        pcVar4 = local_b8.d.ptr;
        pDVar3 = local_b8.d.d;
        if (cVar5 != '\0') {
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_d0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_e8.ptr = (QString *)
                         QArrayData::allocate((QArrayData **)&local_d0,0x18,0x10,1,KeepSize);
          local_e8.d = local_d0.d;
          ((local_e8.ptr)->d).d = pDVar3;
          ((local_e8.ptr)->d).ptr = pcVar4;
          ((local_e8.ptr)->d).size = qVar2;
          if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_e8.size = 1;
          qt_strip_filters((QStringList *)&local_d0,(QStringList *)&local_e8);
          QString::operator=(&local_b8,(QString *)local_d0.ptr);
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_d0);
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
          if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
            }
          }
        }
        if ((local_b8.d.size == local_78.d.size) &&
           (QVar10.m_data = local_b8.d.ptr, QVar10.m_size = local_b8.d.size,
           QVar11.m_data = local_78.d.ptr, QVar11.m_size = local_78.d.size,
           cVar5 = QtPrivate::equalStrings(QVar10,QVar11), cVar5 != '\0')) {
          QString::operator=(__return_storage_ptr__,(QString *)pQVar8);
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          break;
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar8 = pQVar8 + 1;
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileDialog::selectedMimeTypeFilter() const
{
    Q_D(const QFileDialog);
    QString mimeTypeFilter;
    if (!d->usingWidgets())
        mimeTypeFilter = d->selectedMimeTypeFilter_sys();

#if QT_CONFIG(mimetype)
    if (mimeTypeFilter.isNull() && !d->options->mimeTypeFilters().isEmpty()) {
        const auto nameFilter = selectedNameFilter();
        const auto mimeTypes = d->options->mimeTypeFilters();
        for (const auto &mimeType: mimeTypes) {
            QString filter = nameFilterForMime(mimeType);
            if (testOption(HideNameFilterDetails))
                filter = qt_strip_filters({ filter }).constFirst();
            if (filter == nameFilter) {
                mimeTypeFilter = mimeType;
                break;
            }
        }
    }
#endif

    return mimeTypeFilter;
}